

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.h
# Opt level: O2

void __thiscall LinkList<Statistic>::Erase(LinkList<Statistic> *this)

{
  InternalNode *this_00;
  
  while( true ) {
    this_00 = this->pnHead;
    this->pnLastRef = this_00;
    if (this_00 == (InternalNode *)0x0) break;
    this->pnHead = this_00->next;
    Statistic::~Statistic(&this_00->Data);
    operator_delete(this_00);
  }
  this->iLength = 0;
  this->pnLastRef = (InternalNode *)0x0;
  this->pnHead = (InternalNode *)0x0;
  this->pnTail = (InternalNode *)0x0;
  this->iLastRef = -1;
  return;
}

Assistant:

inline void LinkList<T>::Erase()
{
   pnLastRef = pnHead;

   while (pnLastRef != NULL)
   {
      pnHead = pnLastRef->next;
      delete pnLastRef;
      pnLastRef = pnHead;
   }
   SetNull();
}